

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O1

Cdr * __thiscall eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,char *char_t,size_t numElements)

{
  char **ppcVar1;
  char *__src;
  NotEnoughMemoryException *this_00;
  
  __src = (this->m_currentPosition).m_currentPosition;
  if (numElements <= (ulong)((long)(this->m_lastPosition).m_currentPosition - (long)__src)) {
    this->m_lastDataSize = 1;
    memcpy(char_t,__src,numElements);
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + numElements;
    return this;
  }
  this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
  exception::NotEnoughMemoryException::NotEnoughMemoryException
            (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
  __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
              exception::NotEnoughMemoryException::~NotEnoughMemoryException);
}

Assistant:

Cdr::DDSCdrPlFlag Cdr::getDDSCdrPlFlag() const
{
    return m_plFlag;
}